

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O1

void __thiscall
wabt::ExprVisitor::PushCatch(ExprVisitor *this,Expr *expr,Index catch_index,ExprList *expr_list)

{
  pointer *ppiVar1;
  iterator __position;
  iterator __position_00;
  iterator __position_01;
  uint local_2c;
  iterator local_28;
  Expr *local_18;
  
  local_28.list_ = (intrusive_list<wabt::Expr> *)CONCAT44(local_28.list_._4_4_,7);
  __position._M_current =
       (this->state_stack_).
       super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2c = catch_index;
  local_18 = expr;
  if (__position._M_current ==
      (this->state_stack_).
      super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>::
    _M_realloc_insert<wabt::ExprVisitor::State>(&this->state_stack_,__position,(State *)&local_28);
  }
  else {
    *__position._M_current = Catch;
    (this->state_stack_).
    super__Vector_base<wabt::ExprVisitor::State,_std::allocator<wabt::ExprVisitor::State>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  std::vector<wabt::Expr*,std::allocator<wabt::Expr*>>::emplace_back<wabt::Expr*&>
            ((vector<wabt::Expr*,std::allocator<wabt::Expr*>> *)&this->expr_stack_,&local_18);
  local_28.node_ = expr_list->first_;
  __position_00._M_current =
       (this->expr_iter_stack_).
       super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_28.list_ = expr_list;
  if (__position_00._M_current ==
      (this->expr_iter_stack_).
      super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
    ::_M_realloc_insert<wabt::intrusive_list<wabt::Expr>::iterator>
              (&this->expr_iter_stack_,__position_00,&local_28);
  }
  else {
    (__position_00._M_current)->list_ = expr_list;
    (__position_00._M_current)->node_ = local_28.node_;
    ppiVar1 = &(this->expr_iter_stack_).
               super__Vector_base<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppiVar1 = *ppiVar1 + 1;
  }
  __position_01._M_current =
       (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position_01._M_current ==
      (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
              ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->catch_index_stack_,
               __position_01,&local_2c);
  }
  else {
    *__position_01._M_current = local_2c;
    (this->catch_index_stack_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position_01._M_current + 1;
  }
  return;
}

Assistant:

void ExprVisitor::PushCatch(Expr* expr,
                            Index catch_index,
                            ExprList& expr_list) {
  state_stack_.emplace_back(State::Catch);
  expr_stack_.emplace_back(expr);
  expr_iter_stack_.emplace_back(expr_list.begin());
  catch_index_stack_.emplace_back(catch_index);
}